

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O3

void WriteDebugMetrics(ofstream *stream,Metrics *metrics)

{
  ostream *poVar1;
  ulong uVar2;
  pointer ppVar3;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  uVar2 = std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>(uVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  uVar2 = std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>(uVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  uVar2 = std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>(uVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  ppVar3 = (metrics->scoreVsTrue).
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((metrics->scoreVsTrue).
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_finish != ppVar3) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>((double)ppVar3[uVar2].first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
      poVar1 = std::ostream::_M_insert<double>
                         ((double)(metrics->scoreVsTrue).
                                  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar2].second);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      ppVar3 = (metrics->scoreVsTrue).
               super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(metrics->scoreVsTrue).
                                   super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 3));
  }
  return;
}

Assistant:

void WriteDebugMetrics(ofstream& stream, Meter::Metrics& metrics)
{
    stream << metrics.gold << endl << metrics.predicted << endl << metrics.predictedGold << endl << metrics.scoreVsTrue.size() << endl;
    for (int i = 0; i<metrics.scoreVsTrue.size(); ++i) {
        stream << metrics.scoreVsTrue[i].first << ";" << metrics.scoreVsTrue[i].second << endl;
    }
}